

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O0

int ProjectInParametricDomain<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  bool bVar1;
  int iVar2;
  TPZTransform<double> *this;
  long lVar3;
  TPZVec<double> *in_RDI;
  double dVar4;
  REAL val;
  int i;
  REAL distance;
  TPZTransform<double> T2;
  bool IsInSideDomain;
  TPZTransform<double> T1;
  int is;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  REAL winnerDistance;
  int winnerSide;
  int nsides;
  TPZManVector<double,_3> *in_stack_fffffffffffffbc0;
  TPZVec<double> *in_stack_fffffffffffffbc8;
  TPZVec<double> *in_stack_fffffffffffffbd0;
  int64_t in_stack_fffffffffffffbd8;
  TPZManVector<double,_3> *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  int local_3fc;
  double local_3f8;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  TPZVec<double> *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc0;
  int local_a8;
  TPZVec<double> local_98 [3];
  double local_28;
  int local_20;
  undefined4 local_1c;
  TPZVec<double> *local_10;
  int local_4;
  
  local_1c = 7;
  local_10 = in_RDI;
  bVar1 = pztopology::TPZTriangle::IsInParametricDomain
                    (in_stack_fffffffffffffbc8,(REAL)in_stack_fffffffffffffbc0);
  if (bVar1) {
    TPZVec<double>::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    local_4 = 6;
  }
  else {
    local_20 = -1;
    local_28 = 1000000000000.0;
    TPZVec<double>::NElements(local_10);
    TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    this = (TPZTransform<double> *)TPZVec<double>::NElements(local_10);
    TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    for (local_a8 = 0; local_a8 < 6; local_a8 = local_a8 + 1) {
      pztopology::TPZTriangle::SideToSideTransform
                (in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28);
      iVar2 = pztopology::TPZTriangle::SideDimension(0x17d96ef);
      TPZManVector<double,_3>::Resize
                ((TPZManVector<double,_3> *)this,CONCAT44(iVar2,in_stack_fffffffffffffbe8));
      TPZTransform<double>::Apply
                (this,(TPZVec<double> *)CONCAT44(iVar2,in_stack_fffffffffffffbe8),
                 &in_stack_fffffffffffffbe0->super_TPZVec<double>);
      bVar1 = IsInSideParametricDomain<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>
                        (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         (REAL)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      in_stack_fffffffffffffbe8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffdb4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdb4);
      if (bVar1) {
        pztopology::TPZTriangle::SideToSideTransform
                  (in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28);
        TPZTransform<double>::Apply
                  (this,(TPZVec<double> *)CONCAT44(iVar2,in_stack_fffffffffffffbe8),
                   &in_stack_fffffffffffffbe0->super_TPZVec<double>);
        local_3f8 = 0.0;
        local_3fc = 0;
        while( true ) {
          lVar3 = (long)local_3fc;
          in_stack_fffffffffffffbe0 = (TPZManVector<double,_3> *)TPZVec<double>::NElements(local_10)
          ;
          if ((long)in_stack_fffffffffffffbe0 <= lVar3) break;
          in_stack_fffffffffffffbd0 =
               (TPZVec<double> *)TPZVec<double>::operator[](local_10,(long)local_3fc);
          in_stack_fffffffffffffbc0 =
               (TPZManVector<double,_3> *)in_stack_fffffffffffffbd0->_vptr_TPZVec;
          in_stack_fffffffffffffbc8 =
               (TPZVec<double> *)TPZVec<double>::operator[](local_98,(long)local_3fc);
          dVar4 = (double)in_stack_fffffffffffffbc0 -
                  (double)in_stack_fffffffffffffbc8->_vptr_TPZVec;
          local_3f8 = dVar4 * dVar4 + local_3f8;
          local_3fc = local_3fc + 1;
        }
        dVar4 = sqrt(local_3f8);
        if (dVar4 < local_28) {
          local_20 = local_a8;
          local_28 = dVar4;
          TPZVec<double>::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        }
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17d993e);
        in_stack_fffffffffffffdb0 = 0;
      }
      else {
        in_stack_fffffffffffffdb0 = 4;
      }
      TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17d9956);
    }
    local_4 = local_20;
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffbc0);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffbc0);
  }
  return local_4;
}

Assistant:

int ProjectInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    if(Topology::IsInParametricDomain(qsi,0.)){///it is already in the domain
        qsiInDomain = qsi;
        return nsides-1;
    }//if
    
    int winnerSide = -1;
    REAL winnerDistance = 1e12;
    TPZManVector<REAL,3> pt1(qsi.NElements()), pt2(qsi.NElements());
    for(int is = 0; is < nsides-1; is++){
        
        ///Go from NSides-1 to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        pt1.Resize(Topology::SideDimension(is));
        T1.Apply(qsi,pt1);
        
        ///Check if the point is within side boundaries
        bool IsInSideDomain = IsInSideParametricDomain<Topology>(is,pt1,0.);
        if(!IsInSideDomain) continue;
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare original to mapped point
        REAL distance = 0.;
        for(int i = 0; i < qsi.NElements(); i++){
            REAL val = qsi[i]-pt2[i];
            distance += val*val;
        }//i
        distance = sqrt(distance);
        
        ///The closest side point to the original is the projected point
        if(distance < winnerDistance){
            winnerDistance = distance;
            winnerSide = is;
            qsiInDomain = pt2;
        }
    }//for is
    
    return winnerSide;
    
}